

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::reconstruct_xref(QPDF *this,QPDFExc *e,bool found_startxref)

{
  pointer pQVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  void *pvVar2;
  key_type *__k;
  _Rb_tree_header *p_Var3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  key_type *pkVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  _Base_ptr p_Var10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  long *plVar14;
  longlong xref_offset;
  qpdf_offset_t qVar15;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var16;
  QPDFExc *pQVar17;
  QPDFObject *__tmp;
  ulong uVar18;
  size_type *psVar19;
  undefined7 in_register_00000011;
  char *__end;
  uint __len;
  _Base_ptr p_Var20;
  undefined4 uVar21;
  uint uVar22;
  QPDFObjGen *iter;
  pointer plVar23;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *this_01;
  void *pvVar24;
  bool bVar25;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  pVar26;
  QPDFObjectHandle t;
  Token t1;
  int obj;
  Token t2;
  vector<long_long,_std::allocator<long_long>_> trailers;
  vector<long_long,_std::allocator<long_long>_> startxrefs;
  int gen;
  vector<std::tuple<int,_int,_long_long>,_std::allocator<std::tuple<int,_int,_long_long>_>_>
  found_objects;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> to_delete;
  qpdf_offset_t token_start;
  long local_2a0;
  undefined1 local_298 [8];
  _Alloc_hider _Stack_290;
  undefined1 local_288 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240 [2];
  undefined1 local_218 [40];
  undefined1 local_1f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  uint local_184;
  long local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  _Rb_tree_node_base local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined4 local_10c;
  vector<long_long,_std::allocator<long_long>_> local_108;
  vector<long_long,_std::allocator<long_long>_> local_e8;
  string local_d0;
  int local_ac;
  void *local_a8;
  void *pvStack_a0;
  long local_98;
  key_type *local_88;
  key_type *pkStack_80;
  long local_78;
  long *local_68 [2];
  long local_58 [2];
  QPDFObjectHandle local_48;
  long local_38;
  
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var16._M_head_impl)->reconstructed_xref == true) {
    pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
    QPDFExc::QPDFExc(pQVar17,e);
    __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pQVar1 = *(pointer *)((long)&(_Var16._M_head_impl)->warnings + 8);
  lVar12 = *(long *)&((_Var16._M_head_impl)->warnings).
                     super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>;
  (_Var16._M_head_impl)->reconstructed_xref = true;
  (_Var16._M_head_impl)->in_xref_reconstruction = true;
  (_Var16._M_head_impl)->fixed_dangling_refs = false;
  local_1f0._0_8_ = local_1f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"file is damaged","");
  damagedPDF((QPDFExc *)local_298,this,(string *)local_1f0,-1,(string *)local_178);
  warn(this,(QPDFExc *)local_298);
  QPDFExc::~QPDFExc((QPDFExc *)local_298);
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)((long)local_168 + 1));
  }
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
  }
  warn(this,e);
  local_1f0._0_8_ = local_1f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
  local_178._0_8_ = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"Attempting to reconstruct cross-reference table","");
  damagedPDF((QPDFExc *)local_298,this,(string *)local_1f0,-1,(string *)local_178);
  warn(this,(QPDFExc *)local_298);
  QPDFExc::~QPDFExc((QPDFExc *)local_298);
  if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)local_168) {
    operator_delete((void *)local_178._0_8_,(ulong)((long)local_168 + 1));
  }
  local_10c = (undefined4)CONCAT71(in_register_00000011,found_startxref);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
  }
  local_88 = (key_type *)0x0;
  pkStack_80 = (key_type *)0x0;
  local_78 = 0;
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var10 = *(_Base_ptr *)((long)&(_Var16._M_head_impl)->xref_table + 0x18);
  p_Var20 = (_Base_ptr)((long)&(_Var16._M_head_impl)->xref_table + 8);
  if (p_Var10 != p_Var20) {
    do {
      iVar7 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var10[1]._M_parent);
      if (iVar7 == 1) {
        std::vector<QPDFObjGen,std::allocator<QPDFObjGen>>::emplace_back<QPDFObjGen_const&>
                  ((vector<QPDFObjGen,std::allocator<QPDFObjGen>> *)&local_88,
                   (QPDFObjGen *)(p_Var10 + 1));
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      pkVar6 = pkStack_80;
      __k = local_88;
    } while (p_Var10 != p_Var20);
    for (; __k != pkVar6; __k = __k + 1) {
      this_01 = &((this->m)._M_t.
                  super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table;
      pVar26 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
               ::equal_range(&this_01->_M_t,__k);
      std::
      _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node
                    );
    }
  }
  local_a8 = (void *)0x0;
  pvStack_a0 = (void *)0x0;
  local_98 = 0;
  local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longlong *)0x0;
  local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (qpdf_offset_t *)0x0;
  local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (qpdf_offset_t *)0x0;
  local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (longlong *)0x0;
  local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_start = (longlong *)0x0;
  local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (longlong *)0x0;
  plVar14 = *(long **)&(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar14 + 0x28))(plVar14,0,2);
  lVar11 = (**(code **)(**(long **)&(((this->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  uVar21 = local_10c;
  plVar14 = *(long **)&(((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar14 + 0x28))(plVar14,0,0);
  local_180 = ((long)pQVar1 - lVar12 >> 7) + 1000;
  while( true ) {
    lVar12 = (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x20))();
    if (lVar11 <= lVar12) break;
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_1f0,&(_Var16._M_head_impl)->tokenizer,
               ((_Var16._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var16._M_head_impl)->last_object_description,true,10);
    lVar12 = (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x20))();
    uVar13 = local_1f0._16_8_;
    if ((long)local_1f0._16_8_ < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(local_1f0._16_8_);
    }
    local_38 = lVar12 - uVar13;
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (local_1f0._0_4_ == tt_integer) {
      uVar13 = (**(code **)(**(long **)&((_Var16._M_head_impl)->file).
                                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                           + 0x20))();
      _Var16._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      ::qpdf::Tokenizer::readToken
                ((Token *)local_178,&(_Var16._M_head_impl)->tokenizer,
                 ((_Var16._M_head_impl)->file).
                 super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &(_Var16._M_head_impl)->last_object_description,true,10);
      if (local_178._0_4_ == tt_integer) {
        _Var16._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        ::qpdf::Tokenizer::readToken
                  ((Token *)local_298,&(_Var16._M_head_impl)->tokenizer,
                   ((_Var16._M_head_impl)->file).
                   super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &(_Var16._M_head_impl)->last_object_description,true,10);
        local_218._0_8_ = local_218 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"obj","");
        if ((local_298._0_4_ == tt_word) && (local_288._0_8_ == local_218._8_8_)) {
          if ((_Base_ptr)local_288._0_8_ == (_Base_ptr)0x0) {
            bVar25 = true;
          }
          else {
            iVar7 = bcmp(_Stack_290._M_p,(void *)local_218._0_8_,local_288._0_8_);
            bVar25 = iVar7 == 0;
          }
        }
        else {
          bVar25 = false;
        }
        if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_allocated_capacity != local_240) {
          operator_delete((void *)local_250._M_allocated_capacity,
                          local_240[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_allocated_capacity != &local_260) {
          operator_delete((void *)local_270._M_allocated_capacity,
                          (ulong)(local_260._M_allocated_capacity + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_290._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8)) {
          operator_delete(_Stack_290._M_p,(ulong)(local_288._8_8_ + 1));
        }
        if (bVar25) {
          local_184 = QUtil::string_to_int((char *)local_1f0._8_8_);
          local_ac = QUtil::string_to_int((char *)local_178._8_8_);
          if (((this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table_max_id <
              (int)local_184) {
            local_218._0_8_ = local_218 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"");
            uVar9 = -local_184;
            if (0 < (int)local_184) {
              uVar9 = local_184;
            }
            __len = 1;
            if (9 < uVar9) {
              uVar18 = (ulong)uVar9;
              uVar22 = 4;
              do {
                __len = uVar22;
                uVar8 = (uint)uVar18;
                if (uVar8 < 100) {
                  __len = __len - 2;
                  goto LAB_002246bb;
                }
                if (uVar8 < 1000) {
                  __len = __len - 1;
                  goto LAB_002246bb;
                }
                if (uVar8 < 10000) goto LAB_002246bb;
                uVar18 = uVar18 / 10000;
                uVar22 = __len + 4;
              } while (99999 < uVar8);
              __len = __len + 1;
            }
LAB_002246bb:
            uVar22 = local_184 >> 0x1f;
            local_68[0] = local_58;
            std::__cxx11::string::_M_construct
                      ((ulong)local_68,(char)__len - (char)((int)local_184 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)uVar22 + (long)local_68[0]),__len,uVar9);
            plVar14 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x27e756);
            uVar21 = local_10c;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            psVar19 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar19) {
              local_d0.field_2._M_allocated_capacity = *psVar19;
              local_d0.field_2._8_8_ = plVar14[3];
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar19;
              local_d0._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_d0._M_string_length = plVar14[1];
            *plVar14 = (long)psVar19;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            damagedPDF((QPDFExc *)local_298,this,(string *)local_218,-1,&local_d0);
            warn(this,(QPDFExc *)local_298);
            QPDFExc::~QPDFExc((QPDFExc *)local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (local_68[0] != local_58) {
              operator_delete(local_68[0],local_58[0] + 1);
            }
            if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) {
              operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
            }
          }
          else {
            std::vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
            ::emplace_back<int&,int&,long_long&>
                      ((vector<std::tuple<int,int,long_long>,std::allocator<std::tuple<int,int,long_long>>>
                        *)&local_a8,(int *)&local_184,&local_ac,&local_38);
          }
        }
      }
      plVar14 = *(long **)&(((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar14 + 0x28))(plVar14,uVar13,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_left != &local_140) {
        operator_delete(local_160._M_left,local_140._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_node_base *)local_178._8_8_ != &local_160) {
        operator_delete((void *)local_178._8_8_,local_160._0_8_ + 1);
      }
    }
    else {
      if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle == 0) {
        local_298 = (undefined1  [8])local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"trailer","");
        if ((local_1f0._0_4_ == tt_word) && ((pointer)local_1f0._16_8_ == _Stack_290._M_p)) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._16_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar25 = true;
          }
          else {
            iVar7 = bcmp((void *)local_1f0._8_8_,(void *)local_298,local_1f0._16_8_);
            bVar25 = iVar7 == 0;
          }
        }
        else {
          bVar25 = false;
        }
        if (local_298 != (undefined1  [8])local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
        }
        if (bVar25) {
          local_298 = (undefined1  [8])
                      (**(code **)(**(long **)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->file).
                                               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                  + 0x20))();
          if (local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(longlong *)local_298);
          }
          else {
            *local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (longlong)local_298;
            local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_0022489c;
        }
      }
      if ((char)uVar21 == '\0') {
        local_298 = (undefined1  [8])local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"startxref","");
        if ((local_1f0._0_4_ == tt_word) && ((pointer)local_1f0._16_8_ == _Stack_290._M_p)) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._16_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar25 = true;
          }
          else {
            iVar7 = bcmp((void *)local_1f0._8_8_,(void *)local_298,local_1f0._16_8_);
            bVar25 = iVar7 == 0;
          }
        }
        else {
          bVar25 = false;
        }
        if (local_298 != (undefined1  [8])local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
        }
        if (bVar25) {
          local_298 = (undefined1  [8])
                      (**(code **)(**(long **)&(((this->m)._M_t.
                                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                 .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                                _M_head_impl)->file).
                                               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                  + 0x20))();
          if (local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                      (&local_e8,
                       (iterator)
                       local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(longlong *)local_298);
          }
          else {
            *local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (longlong)local_298;
            local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
LAB_0022489c:
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this);
    (**(code **)(**(long **)&(((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> + 0x10))();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._8_8_ != &local_1d8) {
      operator_delete((void *)local_1f0._8_8_,local_1d8._0_8_ + 1);
    }
  }
  pvVar24 = pvStack_a0;
  pvVar2 = local_a8;
  if (((((char)uVar21 == '\0') &&
       (local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) && (local_a8 != pvStack_a0)) &&
     (*(long *)((long)pvStack_a0 + -0x10) <
      local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish[-1])) {
    plVar14 = *(long **)&(((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar14 + 0x28))
              (plVar14,local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1],0);
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_298,&(_Var16._M_head_impl)->tokenizer,
               ((_Var16._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var16._M_head_impl)->last_object_description,true,0);
    xref_offset = QUtil::string_to_ll(_Stack_290._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_allocated_capacity != local_240) {
      operator_delete((void *)local_250._M_allocated_capacity,local_240[0]._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_allocated_capacity != &local_260) {
      operator_delete((void *)local_270._M_allocated_capacity,
                      (ulong)(local_260._M_allocated_capacity + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_290._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_288 + 8)) {
      operator_delete(_Stack_290._M_p,(ulong)(local_288._8_8_ + 1));
    }
    pvVar24 = pvStack_a0;
    pvVar2 = local_a8;
    if (xref_offset != 0) {
      read_xref(this,xref_offset);
      getRoot((QPDF *)local_178);
      local_298 = (undefined1  [8])local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Pages","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f0,(string *)local_178);
      bVar25 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
      }
      if (local_298 != (undefined1  [8])local_288) {
        operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
      }
      if ((_Rb_tree_node_base *)local_178._8_8_ != (_Rb_tree_node_base *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
      }
      pvVar24 = pvStack_a0;
      pvVar2 = local_a8;
      if (bVar25) {
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
        local_178._0_8_ = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"startxref was more than 1024 bytes before end of file","");
        damagedPDF((QPDFExc *)local_298,this,(string *)local_1f0,-1,(string *)local_178);
        warn(this,(QPDFExc *)local_298);
        QPDFExc::~QPDFExc((QPDFExc *)local_298);
        if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)local_168) {
          operator_delete((void *)local_178._0_8_,(ulong)((long)local_168 + 1));
        }
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
        }
        initializeEncryption(this);
        _Var16._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        (_Var16._M_head_impl)->parsed = true;
        (_Var16._M_head_impl)->reconstructed_xref = false;
        goto LAB_00225695;
      }
    }
  }
  for (; pvVar24 != pvVar2; pvVar24 = (void *)((long)pvVar24 + -0x10)) {
    insertXrefEntry(this,*(int *)((long)pvVar24 + -4),1,*(qpdf_offset_t *)((long)pvVar24 + -0x10),
                    *(int *)((long)pvVar24 + -8));
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->deleted_objects)._M_t);
  if (local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    plVar23 = local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      plVar14 = *(long **)&(((this->m)._M_t.
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar14 + 0x28))(plVar14,plVar23[-1],0);
      readTrailer((QPDF *)local_218);
      bVar25 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_218);
      plVar23 = plVar23 + -1;
      if (bVar25) {
        local_298 = (undefined1  [8])local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Root","");
        bVar25 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_218,(string *)local_298);
        if (local_298 != (undefined1  [8])local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
        }
        if (bVar25) {
          _Var16._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          *(undefined8 *)&((_Var16._M_head_impl)->trailer).super_BaseHandle = local_218._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var16._M_head_impl)->trailer + 8),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8));
          if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
          break;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"trailer","");
        qVar15 = *plVar23;
        local_178._0_8_ = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"recovered trailer has no /Root entry","");
        damagedPDF((QPDFExc *)local_298,this,(string *)local_1f0,qVar15,(string *)local_178);
        warn(this,(QPDFExc *)local_298);
        QPDFExc::~QPDFExc((QPDFExc *)local_298);
        if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)local_168) {
          operator_delete((void *)local_178._0_8_,(ulong)((long)local_168 + 1));
        }
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
        }
      }
      reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this);
      if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
      }
    } while (plVar23 !=
             local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle == 0) {
    p_Var10 = *(_Base_ptr *)((long)&(_Var16._M_head_impl)->xref_table + 0x18);
    p_Var20 = (_Base_ptr)((long)&(_Var16._M_head_impl)->xref_table + 8);
    if (p_Var10 != p_Var20) {
      local_2a0 = 0;
      do {
        local_168 = (undefined1  [8])p_Var10[1]._M_right;
        local_178._0_8_ = p_Var10[1]._M_parent;
        local_178._8_8_ = p_Var10[1]._M_left;
        iVar7 = QPDFXRefEntry::getType((QPDFXRefEntry *)local_178);
        if (iVar7 == 1) {
          getObject((QPDF *)local_218,(QPDFObjGen)this);
          local_298 = (undefined1  [8])local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/XRef","");
          local_1f0._0_8_ = local_1f0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
          bVar25 = QPDFObjectHandle::isStreamOfType
                             ((QPDFObjectHandle *)local_218,(string *)local_298,(string *)local_1f0)
          ;
          if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
          }
          if (local_298 != (undefined1  [8])local_288) {
            operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
          }
          if (bVar25) {
            qVar15 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)local_178);
            QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_d0);
            local_298 = (undefined1  [8])local_288;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Size","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1f0,&local_d0);
            uVar9 = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._8_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
            }
            if (local_298 != (undefined1  [8])local_288) {
              operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length);
            }
            if (local_2a0 < qVar15 || uVar9 != 0) {
              QPDFObjectHandle::getDict(&local_48);
              _Var16._M_head_impl =
                   (this->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
              if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle == 0) {
                *(element_type **)&((_Var16._M_head_impl)->trailer).super_BaseHandle =
                     local_48.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&(_Var16._M_head_impl)->trailer + 8),
                           &local_48.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              }
              local_2a0 = qVar15;
              if (local_48.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_48.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this)
            ;
          }
          if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != p_Var20);
      if (0 < local_2a0) {
        read_xref(this,local_2a0);
      }
    }
  }
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle == 0) {
LAB_00224fa7:
    local_218._0_8_ = (_Base_ptr)0x0;
    local_218._8_8_ = (_Base_ptr)0x0;
    p_Var10 = *(_Base_ptr *)((long)&((_Var16._M_head_impl)->obj_cache)._M_t + 0x18);
    p_Var3 = (_Rb_tree_header *)((long)&((_Var16._M_head_impl)->obj_cache)._M_t + 8);
    if ((_Rb_tree_header *)p_Var10 != p_Var3) {
      do {
        local_178._0_8_ = p_Var10[1]._M_parent;
        local_178._8_8_ = p_Var10[1]._M_left;
        if ((_Rb_tree_node_base *)local_178._8_8_ != (_Rb_tree_node_base *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Rb_tree_node_base *)local_178._8_8_)->_M_parent =
                 *(int *)&((_Rb_tree_node_base *)local_178._8_8_)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Rb_tree_node_base *)local_178._8_8_)->_M_parent =
                 *(int *)&((_Rb_tree_node_base *)local_178._8_8_)->_M_parent + 1;
          }
        }
        local_298 = (undefined1  [8])local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Catalog","");
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"","");
        bVar25 = QPDFObjectHandle::isDictionaryOfType
                           ((QPDFObjectHandle *)local_178,(string *)local_298,(string *)local_1f0);
        if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
          operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
        }
        if (local_298 != (undefined1  [8])local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
        }
        if ((_Rb_tree_node_base *)local_178._8_8_ != (_Rb_tree_node_base *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
        }
        uVar13 = local_218._8_8_;
        if (bVar25) {
          local_218._0_8_ = p_Var10[1]._M_parent;
          p_Var20 = p_Var10[1]._M_left;
          if (p_Var20 != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&p_Var20->_M_parent = *(int *)&p_Var20->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&p_Var20->_M_parent = *(int *)&p_Var20->_M_parent + 1;
            }
          }
          bVar25 = (_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0;
          local_218._8_8_ = p_Var20;
          if (bVar25) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13);
          }
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var3);
      if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)0x0) {
        _Var16._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
             super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle == 0) {
          local_1f0._0_8_ = local_1f0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"");
          local_178._0_8_ = local_168;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "unable to find trailer dictionary while recovering damaged file","");
          damagedPDF((QPDFExc *)local_298,this,(string *)local_1f0,-1,(string *)local_178);
          warn(this,(QPDFExc *)local_298);
          QPDFExc::~QPDFExc((QPDFExc *)local_298);
          if ((_Base_ptr)local_178._0_8_ != (_Base_ptr)local_168) {
            operator_delete((void *)local_178._0_8_,(ulong)((long)local_168 + 1));
          }
          if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
            operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
          }
          QPDFObjectHandle::newDictionary();
          _Var5._M_p = _Stack_290._M_p;
          auVar4 = local_298;
          _Var16._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          local_298 = (undefined1  [8])0x0;
          _Stack_290._M_p = (pointer)0x0;
          this_00._M_pi =
               ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(_Var16._M_head_impl)->trailer + 8))->_M_pi;
          *(undefined1 (*) [8])&((_Var16._M_head_impl)->trailer).super_BaseHandle = auVar4;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var16._M_head_impl)->trailer + 8)
          )->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var5._M_p;
          if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_290._M_p !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_290._M_p);
          }
          _Var16._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
        }
        local_298 = (undefined1  [8])local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Root","");
        QPDFObjectHandle::replaceKey
                  (&(_Var16._M_head_impl)->trailer,(string *)local_298,(QPDFObjectHandle *)local_218
                  );
        if (local_298 != (undefined1  [8])local_288) {
          operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
        }
      }
    }
    if ((_Base_ptr)local_218._8_8_ != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  else if ((_Var16._M_head_impl)->parsed == false) {
    local_298 = (undefined1  [8])local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Root","");
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)local_1f0,(string *)&(_Var16._M_head_impl)->trailer);
    bVar25 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._8_8_);
    }
    if (local_298 != (undefined1  [8])local_288) {
      operator_delete((void *)local_298,(ulong)(local_288._0_8_ + 1));
    }
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (!bVar25) goto LAB_00224fa7;
  }
  if (*(long *)&((_Var16._M_head_impl)->trailer).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> == 0) {
    pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_298 = (undefined1  [8])local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"unable to find trailer dictionary while recovering damaged file"
               ,"");
    damagedPDF(pQVar17,this,(string *)local_298,-1,(string *)local_1f0);
    __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  if (*(size_t *)((long)&((_Var16._M_head_impl)->xref_table)._M_t + 0x28) == 0) {
    pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_298 = (undefined1  [8])local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f0,"unable to find objects while recovering damaged file","");
    damagedPDF(pQVar17,this,(string *)local_298,-1,(string *)local_1f0);
    __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this);
  _Var16._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if ((_Var16._M_head_impl)->parsed == false) {
    (_Var16._M_head_impl)->parsed = true;
    getAllPages(this);
    reconstruct_xref::anon_class_16_2_2ef5c38d::operator()((anon_class_16_2_2ef5c38d *)this);
    _Var16._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    if (*(pointer *)
         &((_Var16._M_head_impl)->all_pages).
          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl ==
        *(pointer *)((long)&(_Var16._M_head_impl)->all_pages + 8)) {
      (_Var16._M_head_impl)->parsed = false;
      pQVar17 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_298 = (undefined1  [8])local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
      local_1f0._0_8_ = local_1f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f0,"unable to find any pages while recovering damaged file","");
      damagedPDF(pQVar17,this,(string *)local_298,-1,(string *)local_1f0);
      __cxa_throw(pQVar17,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  (_Var16._M_head_impl)->in_xref_reconstruction = false;
LAB_00225695:
  if (local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (longlong *)0x0) {
    operator_delete(local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (qpdf_offset_t *)0x0) {
    operator_delete(local_108.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_88 != (key_type *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return;
}

Assistant:

void
QPDF::reconstruct_xref(QPDFExc& e, bool found_startxref)
{
    if (m->reconstructed_xref) {
        // Avoid xref reconstruction infinite loops. This is getting very hard to reproduce because
        // qpdf is throwing many fewer exceptions while parsing. Most situations are warnings now.
        throw e;
    }

    // If recovery generates more than 1000 warnings, the file is so severely damaged that there
    // probably is no point trying to continue.
    const auto max_warnings = m->warnings.size() + 1000U;
    auto check_warnings = [this, max_warnings]() {
        if (m->warnings.size() > max_warnings) {
            throw damagedPDF("", -1, "too many errors while reconstructing cross-reference table");
        }
    };

    m->reconstructed_xref = true;
    m->in_xref_reconstruction = true;
    // We may find more objects, which may contain dangling references.
    m->fixed_dangling_refs = false;

    warn(damagedPDF("", -1, "file is damaged"));
    warn(e);
    warn(damagedPDF("", -1, "Attempting to reconstruct cross-reference table"));

    // Delete all references to type 1 (uncompressed) objects
    std::vector<QPDFObjGen> to_delete;
    for (auto const& iter: m->xref_table) {
        if (iter.second.getType() == 1) {
            to_delete.emplace_back(iter.first);
        }
    }
    for (auto const& iter: to_delete) {
        m->xref_table.erase(iter);
    }

    std::vector<std::tuple<int, int, qpdf_offset_t>> found_objects;
    std::vector<qpdf_offset_t> trailers;
    std::vector<qpdf_offset_t> startxrefs;

    m->file->seek(0, SEEK_END);
    qpdf_offset_t eof = m->file->tell();
    m->file->seek(0, SEEK_SET);
    // Don't allow very long tokens here during recovery. All the interesting tokens are covered.
    static size_t const MAX_LEN = 10;
    while (m->file->tell() < eof) {
        QPDFTokenizer::Token t1 = readToken(*m->file, MAX_LEN);
        qpdf_offset_t token_start = m->file->tell() - toO(t1.getValue().length());
        if (t1.isInteger()) {
            auto pos = m->file->tell();
            auto t2 = readToken(*m->file, MAX_LEN);
            if (t2.isInteger() && readToken(*m->file, MAX_LEN).isWord("obj")) {
                int obj = QUtil::string_to_int(t1.getValue().c_str());
                int gen = QUtil::string_to_int(t2.getValue().c_str());
                if (obj <= m->xref_table_max_id) {
                    found_objects.emplace_back(obj, gen, token_start);
                } else {
                    warn(damagedPDF(
                        "", -1, "ignoring object with impossibly large id " + std::to_string(obj)));
                }
            }
            m->file->seek(pos, SEEK_SET);
        } else if (!m->trailer && t1.isWord("trailer")) {
            trailers.emplace_back(m->file->tell());
        } else if (!found_startxref && t1.isWord("startxref")) {
            startxrefs.emplace_back(m->file->tell());
        }
        check_warnings();
        m->file->findAndSkipNextEOL();
    }

    if (!found_startxref && !startxrefs.empty() && !found_objects.empty() &&
        startxrefs.back() > std::get<2>(found_objects.back())) {
        try {
            m->file->seek(startxrefs.back(), SEEK_SET);
            if (auto offset = QUtil::string_to_ll(readToken(*m->file).getValue().data())) {
                read_xref(offset);
                if (getRoot().getKey("/Pages").isDictionary()) {
                    QTC::TC("qpdf", "QPDF startxref more than 1024 before end");
                    warn(damagedPDF(
                        "", -1, "startxref was more than 1024 bytes before end of file"));
                    initializeEncryption();
                    m->parsed = true;
                    m->reconstructed_xref = false;
                    return;
                }
            }
        } catch (...) {
            // ok, bad luck. Do recovery.
        }
    }

    auto rend = found_objects.rend();
    for (auto it = found_objects.rbegin(); it != rend; it++) {
        auto [obj, gen, token_start] = *it;
        insertXrefEntry(obj, 1, token_start, gen);
        check_warnings();
    }
    m->deleted_objects.clear();

    for (auto it = trailers.rbegin(); it != trailers.rend(); it++) {
        m->file->seek(*it, SEEK_SET);
        auto t = readTrailer();
        if (!t.isDictionary()) {
            // Oh well.  It was worth a try.
        } else {
            if (t.hasKey("/Root")) {
                m->trailer = t;
                break;
            }
            warn(damagedPDF("trailer", *it, "recovered trailer has no /Root entry"));
        }
        check_warnings();
    }

    if (!m->trailer) {
        qpdf_offset_t max_offset{0};
        size_t max_size{0};
        // If there are any xref streams, take the last one to appear.
        for (auto const& iter: m->xref_table) {
            auto entry = iter.second;
            if (entry.getType() != 1) {
                continue;
            }
            auto oh = getObject(iter.first);
            try {
                if (!oh.isStreamOfType("/XRef")) {
                    continue;
                }
            } catch (std::exception&) {
                continue;
            }
            auto offset = entry.getOffset();
            auto size = oh.getDict().getKey("/Size").getUIntValueAsUInt();
            if (size > max_size || (size == max_size && offset > max_offset)) {
                max_offset = offset;
                setTrailer(oh.getDict());
            }
            check_warnings();
        }
        if (max_offset > 0) {
            try {
                read_xref(max_offset);
            } catch (std::exception&) {
                warn(damagedPDF(
                    "", -1, "error decoding candidate xref stream while recovering damaged file"));
            }
            QTC::TC("qpdf", "QPDF recover xref stream");
        }
    }

    if (!m->trailer || (!m->parsed && !m->trailer.getKey("/Root").isDictionary())) {
        // Try to find a Root dictionary. As a quick fix try the one with the highest object id.
        QPDFObjectHandle root;
        for (auto const& iter: m->obj_cache) {
            try {
                if (QPDFObjectHandle(iter.second.object).isDictionaryOfType("/Catalog")) {
                    root = iter.second.object;
                }
            } catch (std::exception&) {
                continue;
            }
        }
        if (root) {
            if (!m->trailer) {
                warn(damagedPDF(
                    "", -1, "unable to find trailer dictionary while recovering damaged file"));
                m->trailer = QPDFObjectHandle::newDictionary();
            }
            m->trailer.replaceKey("/Root", root);
        }
    }

    if (!m->trailer) {
        // We could check the last encountered object to see if it was an xref stream.  If so, we
        // could try to get the trailer from there.  This may make it possible to recover files with
        // bad startxref pointers even when they have object streams.

        throw damagedPDF("", -1, "unable to find trailer dictionary while recovering damaged file");
    }
    if (m->xref_table.empty()) {
        // We cannot check for an empty xref table in parse because empty tables are valid when
        // creating QPDF objects from JSON.
        throw damagedPDF("", -1, "unable to find objects while recovering damaged file");
    }
    check_warnings();
    if (!m->parsed) {
        m->parsed = true;
        getAllPages();
        check_warnings();
        if (m->all_pages.empty()) {
            m->parsed = false;
            throw damagedPDF("", -1, "unable to find any pages while recovering damaged file");
        }
    }

    m->in_xref_reconstruction = false;
    // We could iterate through the objects looking for streams and try to find objects inside of
    // them, but it's probably not worth the trouble.  Acrobat can't recover files with any errors
    // in an xref stream, and this would be a real long shot anyway.  If we wanted to do anything
    // that involved looking at stream contents, we'd also have to call initializeEncryption() here.
    // It's safe to call it more than once.
}